

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_x86.cpp
# Opt level: O0

int __thiscall ncnn::Convolution_x86::create_pipeline_int8_x86(Convolution_x86 *this,Option *opt)

{
  ulong uVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  long in_RSI;
  Mat *in_RDI;
  char *k00;
  int i;
  int j;
  int k;
  char *g00;
  int p;
  Mat g0;
  int q;
  Mat weight_data_r2;
  int out_elempack;
  int elempack;
  int num_input;
  int maxk;
  int in_stack_fffffffffffffea4;
  size_t in_stack_fffffffffffffea8;
  undefined8 in_stack_fffffffffffffeb0;
  Mat *in_stack_fffffffffffffec8;
  Allocator *in_stack_fffffffffffffed0;
  int local_e4;
  int local_e0;
  int local_dc;
  char *local_d8;
  int local_cc;
  Allocator *in_stack_ffffffffffffff40;
  int in_stack_ffffffffffffff4c;
  int in_stack_ffffffffffffff50;
  int in_stack_ffffffffffffff54;
  Mat *in_stack_ffffffffffffff58;
  Option *in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff80;
  int iVar5;
  int in_stack_ffffffffffffff84;
  Mat *in_stack_ffffffffffffff88;
  Mat *in_stack_ffffffffffffff90;
  int in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  int in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffc4;
  Mat *in_stack_ffffffffffffffc8;
  Mat *in_stack_ffffffffffffffd0;
  int local_28;
  int local_24;
  
  iVar5 = (int)((ulong)in_stack_fffffffffffffeb0 >> 0x20);
  iVar2 = *(int *)((long)&in_RDI[2].cstep + *(long *)((long)in_RDI->data + -0x18) + 4) *
          *(int *)((long)&in_RDI[3].data + *(long *)((long)in_RDI->data + -0x18));
  uVar1 = (long)*(int *)((long)&in_RDI[3].w + *(long *)((long)in_RDI->data + -0x18)) / (long)iVar2;
  iVar3 = (int)((long)((ulong)(uint)((int)uVar1 >> 0x1f) << 0x20 | uVar1 & 0xffffffff) /
               (long)*(int *)((long)&in_RDI[2].cstep + *(long *)((long)in_RDI->data + -0x18)));
  local_24 = 1;
  local_28 = 1;
  if ((*(byte *)(in_RSI + 0x27) & 1) != 0) {
    local_24 = 1;
    if (iVar3 % 8 == 0) {
      local_24 = 8;
    }
    local_28 = 1;
    if (*(int *)((long)&in_RDI[2].cstep + *(long *)((long)in_RDI->data + -0x18)) % 4 == 0) {
      local_28 = 4;
    }
  }
  if ((local_24 == 1) && (local_28 == 1)) {
    if (((((((*(byte *)(in_RSI + 0x1c) & 1) != 0) &&
           (*(int *)((long)&in_RDI[2].cstep + *(long *)((long)in_RDI->data + -0x18) + 4) == 3)) &&
          (*(int *)((long)&in_RDI[3].data + *(long *)((long)in_RDI->data + -0x18)) == 3)) &&
         ((*(int *)((long)&in_RDI[3].data + *(long *)((long)in_RDI->data + -0x18) + 4) == 1 &&
          (*(int *)((long)&in_RDI[3].refcount + *(long *)((long)in_RDI->data + -0x18)) == 1)))) &&
        ((*(int *)((long)&in_RDI[3].refcount + *(long *)((long)in_RDI->data + -0x18) + 4) == 1 &&
         ((*(int *)((long)&in_RDI[3].elemsize + *(long *)((long)in_RDI->data + -0x18)) == 1 &&
          (0xf < iVar3)))))) &&
       (0xf < *(int *)((long)&in_RDI[2].cstep + *(long *)((long)in_RDI->data + -0x18)))) {
      conv3x3s1_winograd23_transform_kernel_int8_sse
                (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff84,
                 in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    }
  }
  else {
    ncnn::Mat::reshape(in_stack_ffffffffffffff58,in_stack_ffffffffffffff54,in_stack_ffffffffffffff50
                       ,in_stack_ffffffffffffff4c,in_stack_ffffffffffffff40);
    ncnn::Mat::create(in_RDI,local_28,iVar3 / local_24,iVar5,in_stack_fffffffffffffea8,
                      in_stack_fffffffffffffea4,in_stack_fffffffffffffed0);
    for (iVar5 = 0;
        iVar5 + local_28 + -1 <
        *(int *)((long)&in_RDI[2].cstep + *(long *)((long)in_RDI->data + -0x18));
        iVar5 = local_28 + iVar5) {
      ncnn::Mat::channel(in_stack_fffffffffffffec8,(int)((ulong)in_RDI >> 0x20));
      for (local_cc = 0; local_cc + local_24 + -1 < iVar3; local_cc = local_24 + local_cc) {
        local_d8 = ncnn::Mat::row<signed_char>((Mat *)&stack0xffffffffffffff38,local_cc / local_24);
        for (local_dc = 0; local_dc < iVar2; local_dc = local_dc + 1) {
          for (local_e0 = 0; local_e0 < local_28; local_e0 = local_e0 + 1) {
            for (local_e4 = 0; local_e4 < local_24; local_e4 = local_e4 + 1) {
              ncnn::Mat::channel(in_stack_fffffffffffffec8,(int)((ulong)in_RDI >> 0x20));
              pcVar4 = ncnn::Mat::row<signed_char_const>
                                 ((Mat *)&stack0xfffffffffffffec8,local_cc + local_e4);
              ncnn::Mat::~Mat((Mat *)0x1a6c3d);
              *local_d8 = pcVar4[local_dc];
              local_d8 = local_d8 + 1;
            }
          }
        }
      }
      ncnn::Mat::~Mat((Mat *)0x1a6d36);
    }
    ncnn::Mat::~Mat((Mat *)0x1a6d6f);
    if ((local_24 == 8) && (local_28 == 4)) {
      if ((*(int *)((long)&in_RDI[2].cstep + *(long *)((long)in_RDI->data + -0x18) + 4) == 1) &&
         ((((*(int *)((long)&in_RDI[3].data + *(long *)((long)in_RDI->data + -0x18)) == 1 &&
            (*(int *)((long)&in_RDI[3].data + *(long *)((long)in_RDI->data + -0x18) + 4) == 1)) &&
           (*(int *)((long)&in_RDI[3].refcount + *(long *)((long)in_RDI->data + -0x18)) == 1)) &&
          ((*(int *)((long)&in_RDI[3].refcount + *(long *)((long)in_RDI->data + -0x18) + 4) == 1 &&
           (*(int *)((long)&in_RDI[3].elemsize + *(long *)((long)in_RDI->data + -0x18)) == 1)))))) {
        convolution_im2col_sgemm_transform_kernel_pack8to4_int8_sse
                  (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc4,
                   in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8);
      }
      else if ((*(int *)((long)&in_RDI[2].cstep + *(long *)((long)in_RDI->data + -0x18) + 4) == 1)
              && (((*(int *)((long)&in_RDI[3].data + *(long *)((long)in_RDI->data + -0x18)) == 1 &&
                   (*(int *)((long)&in_RDI[3].data + *(long *)((long)in_RDI->data + -0x18) + 4) == 1
                   )) && ((*(int *)((long)&in_RDI[3].refcount +
                                   *(long *)((long)in_RDI->data + -0x18)) == 1 &&
                          ((*(int *)((long)&in_RDI[3].refcount +
                                    *(long *)((long)in_RDI->data + -0x18) + 4) == 2 &&
                           (*(int *)((long)&in_RDI[3].elemsize +
                                    *(long *)((long)in_RDI->data + -0x18)) == 2)))))))) {
        convolution_im2col_sgemm_transform_kernel_pack8to4_int8_sse
                  (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc4,
                   in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8);
      }
      else if ((*(byte *)(in_RSI + 0x1d) & 1) != 0) {
        convolution_im2col_sgemm_transform_kernel_pack8to4_int8_sse
                  (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc4,
                   in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8);
      }
    }
  }
  return 0;
}

Assistant:

int Convolution_x86::create_pipeline_int8_x86(const Option& opt)
{
    const int maxk = kernel_w * kernel_h;
    const int num_input = weight_data_size / maxk / num_output;

    int elempack = 1;
    int out_elempack = 1;

#if __SSE2__
    if (opt.use_packing_layout)
    {
        elempack = num_input % 8 == 0 ? 8 : 1;
        out_elempack = num_output % 4 == 0 ? 4 : 1;
    }
#endif // __SSE2__

    if (elempack == 1 && out_elempack == 1)
    {
        if (opt.use_winograd_convolution && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1 && num_input >= 16 && num_output >= 16)
        {
            conv3x3s1_winograd23_transform_kernel_int8_sse(weight_data, weight_data_3x3_winograd23_int8, num_input, num_output, opt);
            //         conv3x3s1_winograd43_transform_kernel_int8_sse(weight_data, weight_data_3x3_winograd23_int8, num_input, num_output, opt);
        }
        else
        {
            // TODO offline transform weight
        }

        return 0;
    }

    // src = kw-kh-inch-outch
    // dst = pa-pb-kw-kh-inch/pa-outch/pb
    {
        Mat weight_data_r2 = weight_data.reshape(maxk, num_input, num_output);

        weight_data_int8.create(maxk, num_input / elempack, num_output / out_elempack, (size_t)elempack * out_elempack, elempack * out_elempack);

        for (int q = 0; q + (out_elempack - 1) < num_output; q += out_elempack)
        {
            Mat g0 = weight_data_int8.channel(q / out_elempack);

            for (int p = 0; p + (elempack - 1) < num_input; p += elempack)
            {
                signed char* g00 = g0.row<signed char>(p / elempack);

                for (int k = 0; k < maxk; k++)
                {
                    for (int j = 0; j < out_elempack; j++)
                    {
                        for (int i = 0; i < elempack; i++)
                        {
                            const signed char* k00 = weight_data_r2.channel(q + j).row<const signed char>(p + i);

                            g00[0] = k00[k];

                            g00++;
                        }
                    }
                }
            }
        }
    }

#if __SSE2__
    if (elempack == 8 && out_elempack == 4)
    {
        if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            convolution_im2col_sgemm_transform_kernel_pack8to4_int8_sse(weight_data, weight_data_int8, num_input, num_output, kernel_w, kernel_h);
        }
        else if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            convolution_im2col_sgemm_transform_kernel_pack8to4_int8_sse(weight_data, weight_data_int8, num_input, num_output, kernel_w, kernel_h);
        }
        else if (opt.use_sgemm_convolution)
        {
            convolution_im2col_sgemm_transform_kernel_pack8to4_int8_sse(weight_data, weight_data_int8, num_input, num_output, kernel_w, kernel_h);
        }
    }
#endif // __SSE2__

    return 0;
}